

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementTetraCorot_4::UpdateRotation(ChElementTetraCorot_4 *this)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  Scalar *pSVar3;
  Scalar *pSVar4;
  int row;
  long row_00;
  ChMatrix33<double> *this_00;
  int colres;
  long col_00;
  int col;
  long col_01;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ChMatrix33<double> F;
  ChMatrix33<double> S;
  ChMatrixNM<double,_4,_4> P;
  Scalar local_1b0;
  undefined1 *local_198;
  Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,__1,__1,_false> local_190;
  undefined1 *local_148 [9];
  DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1> local_100 [208];
  
  local_148[0] = (undefined1 *)
                 ((long)&((((this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->super_ChNodeFEAbase + 0x20);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            (&local_190,(Matrix<double,_4,_4,_1,_4,_4> *)local_100,0,0,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_190,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_148);
  local_148[0] = (undefined1 *)
                 ((long)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            (&local_190,(Matrix<double,_4,_4,_1,_4,_4> *)local_100,0,1,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_190,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_148);
  local_148[0] = (undefined1 *)
                 ((long)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            (&local_190,(Matrix<double,_4,_4,_1,_4,_4> *)local_100,0,2,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_190,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_148);
  local_148[0] = (undefined1 *)
                 ((long)&((this->nodes).
                          super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[3].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->super_ChNodeFEAbase + 0x20);
  Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_-1,_-1,_false>::Block
            (&local_190,(Matrix<double,_4,_4,_1,_4,_4> *)local_100,0,3,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,1,4,4>,_1,_1,false>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>
            (&local_190,
             (Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_148);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true,_true> *)
                  &local_190,(Matrix<double,_4,_4,_1,_4,_4> *)local_100,3);
  local_148[0] = (undefined1 *)0x3ff0000000000000;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_>::setConstant
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1,_4,_true>_> *)
             &local_190,(Scalar *)local_148);
  for (col_00 = 0; col_00 != 3; col_00 = col_00 + 1) {
    for (row_00 = 0; row_00 != 3; row_00 = row_00 + 1) {
      col_01 = 0;
      local_1b0 = 0.0;
      while (col_01 != 4) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>::operator()
                           (local_100,row_00,col_01);
        SVar1 = *pSVar3;
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_1> *)&this->mM,
                            col_01,col_00);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_1b0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = SVar1;
        col_01 = col_01 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pSVar3;
        auVar2 = vfmadd231sd_fma(auVar6,auVar7,auVar2);
        local_1b0 = auVar2._0_8_;
      }
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1> *)&local_190,
                          row_00,col_00);
      *pSVar4 = local_1b0;
    }
  }
  this_00 = &(this->super_ChElementCorotational).A;
  dVar5 = PolarDecomposition::Compute
                    ((double *)&local_190,(double *)this_00,(double *)local_148,1e-06);
  if (dVar5 < 0.0) {
    local_198 = &DAT_bff0000000000000;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=
              ((DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)this_00,(Scalar *)&local_198);
  }
  return;
}

Assistant:

void ChElementTetraCorot_4::UpdateRotation() {
    // P = [ p_0  p_1  p_2  p_3 ]
    //     [ 1    1    1    1   ]
    ChMatrixNM<double, 4, 4> P;
    P.block(0, 0, 3, 1) = nodes[0]->pos.eigen();
    P.block(0, 1, 3, 1) = nodes[1]->pos.eigen();
    P.block(0, 2, 3, 1) = nodes[2]->pos.eigen();
    P.block(0, 3, 3, 1) = nodes[3]->pos.eigen();
    P.row(3).setConstant(1.0);

    ChMatrix33<double> F;
    // F=P*mM (only upper-left 3x3 block!)
    double sum;
    for (int colres = 0; colres < 3; ++colres)
        for (int row = 0; row < 3; ++row) {
            sum = 0;
            for (int col = 0; col < 4; ++col)
                sum += (P(row, col)) * (mM(col, colres));
            F(row, colres) = sum;
        }
    ChMatrix33<> S;
    double det = ChPolarDecomposition<>::Compute(F, this->A, S, 1E-6);
    if (det < 0)
        this->A *= -1.0;

    // GetLog() << "FEM rotation: \n" << A << "\n" ;
}